

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ion.c
# Opt level: O0

MPP_RET allocator_ion_alloc(void *ctx,MppBufferInfo *info)

{
  MppBufferInfo *pMVar1;
  allocator_ctx_ion *p;
  int local_28;
  ion_user_handle_t hnd;
  int fd;
  MPP_RET ret;
  MppBufferInfo *info_local;
  void *ctx_local;
  
  hnd = 0;
  local_28 = -1;
  p._4_4_ = 0xffffffff;
  _fd = info;
  info_local = (MppBufferInfo *)ctx;
  if (ctx == (void *)0x0) {
    _mpp_log_l(2,"mpp_ion","os_allocator_close Android do not accept NULL input\n",(char *)0x0);
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if ((ion_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_ion","enter: ctx %p size %d\n","allocator_ion_alloc",ctx,info->size);
    }
    pMVar1 = info_local;
    hnd = ion_alloc((int)info_local->size,_fd->size,*(size_t *)info_local,ion_heap_mask,0,
                    (ion_user_handle_t *)((long)&p + 4));
    if (hnd == 0) {
      hnd = ion_map_fd((int)pMVar1->size,p._4_4_,&local_28);
      if (hnd != 0) {
        _mpp_log_l(2,"mpp_ion","ion_map_fd failed ret %d\n","allocator_ion_alloc",(ulong)(uint)hnd);
      }
    }
    else {
      _mpp_log_l(2,"mpp_ion","ion_alloc failed ret %d\n","allocator_ion_alloc",(ulong)(uint)hnd);
    }
    _fd->fd = local_28;
    _fd->ptr = (void *)0x0;
    _fd->hnd = (void *)(long)(int)p._4_4_;
    if ((ion_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_ion","leave: ret %d handle %d fd %d\n","allocator_ion_alloc",
                 (ulong)(uint)hnd,(ulong)p._4_4_,local_28);
    }
    ctx_local._4_4_ = hnd;
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET allocator_ion_alloc(void *ctx, MppBufferInfo *info)
{
    MPP_RET ret = MPP_OK;
    int fd = -1;
    ion_user_handle_t hnd = -1;
    allocator_ctx_ion *p = NULL;

    if (NULL == ctx) {
        mpp_err("os_allocator_close Android do not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    ion_dbg_func("enter: ctx %p size %d\n", ctx, info->size);

    p = (allocator_ctx_ion *)ctx;
    ret = ion_alloc(p->ion_device, info->size, p->alignment, ion_heap_mask,
                    0, &hnd);
    if (ret)
        mpp_err_f("ion_alloc failed ret %d\n", ret);
    else {
        ret = ion_map_fd(p->ion_device, hnd, &fd);
        if (ret)
            mpp_err_f("ion_map_fd failed ret %d\n", ret);
    }

    info->fd  = fd;
    info->ptr = NULL;
    info->hnd = (void *)(intptr_t)hnd;

    ion_dbg_func("leave: ret %d handle %d fd %d\n", ret, hnd, fd);
    return ret;
}